

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

void __thiscall
ON_3dmObjectAttributes::ON_3dmObjectAttributes
          (ON_3dmObjectAttributes *this,ON_3dmObjectAttributes *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_3dmObjectAttributes *src_local;
  ON_3dmObjectAttributes *this_local;
  
  ON_Object::ON_Object(&this->super_ON_Object,&src->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b67530;
  (this->m_uuid).Data1 = 0;
  (this->m_uuid).Data2 = 0;
  (this->m_uuid).Data3 = 0;
  (this->m_uuid).Data4[0] = '\0';
  (this->m_uuid).Data4[1] = '\0';
  (this->m_uuid).Data4[2] = '\0';
  (this->m_uuid).Data4[3] = '\0';
  (this->m_uuid).Data4[4] = '\0';
  (this->m_uuid).Data4[5] = '\0';
  (this->m_uuid).Data4[6] = '\0';
  (this->m_uuid).Data4[7] = '\0';
  ON_wString::ON_wString(&this->m_name);
  ON_wString::ON_wString(&this->m_url);
  this->m_layer_index = 0;
  this->m_linetype_index = -1;
  this->m_material_index = -1;
  ON_ObjectRenderingAttributes::ON_ObjectRenderingAttributes(&this->m_rendering_attributes);
  ON_Color::ON_Color(&this->m_color,0,0,0);
  ON_Color::ON_Color(&this->m_plot_color,0,0,0);
  this->m_display_order = 0;
  this->m_plot_weight_mm = 0.0;
  this->m_object_decoration = no_object_decoration;
  this->m_wire_density = 1;
  (this->m_viewport_id).Data1 = 0;
  (this->m_viewport_id).Data2 = 0;
  (this->m_viewport_id).Data3 = 0;
  (this->m_viewport_id).Data4[0] = '\0';
  (this->m_viewport_id).Data4[1] = '\0';
  (this->m_viewport_id).Data4[2] = '\0';
  (this->m_viewport_id).Data4[3] = '\0';
  (this->m_viewport_id).Data4[4] = '\0';
  (this->m_viewport_id).Data4[5] = '\0';
  (this->m_viewport_id).Data4[6] = '\0';
  (this->m_viewport_id).Data4[7] = '\0';
  this->m_space = model_space;
  this->m_bVisible = true;
  this->m_mode = '\0';
  this->m_color_source = '\0';
  this->m_plot_color_source = '\0';
  this->m_plot_weight_source = '\0';
  this->m_material_source = '\0';
  this->m_linetype_source = '\0';
  this->m_reserved_0 = '\0';
  dVar1 = ON_Plane::UnsetPlane.plane_equation.d;
  (this->m_object_frame).plane_equation.z = ON_Plane::UnsetPlane.plane_equation.z;
  (this->m_object_frame).plane_equation.d = dVar1;
  dVar1 = ON_Plane::UnsetPlane.plane_equation.y;
  (this->m_object_frame).plane_equation.x = ON_Plane::UnsetPlane.plane_equation.x;
  (this->m_object_frame).plane_equation.y = dVar1;
  dVar1 = ON_Plane::UnsetPlane.zaxis.z;
  (this->m_object_frame).zaxis.y = ON_Plane::UnsetPlane.zaxis.y;
  (this->m_object_frame).zaxis.z = dVar1;
  dVar1 = ON_Plane::UnsetPlane.zaxis.x;
  (this->m_object_frame).yaxis.z = ON_Plane::UnsetPlane.yaxis.z;
  (this->m_object_frame).zaxis.x = dVar1;
  dVar7 = ON_Plane::UnsetPlane.yaxis.y;
  dVar6 = ON_Plane::UnsetPlane.xaxis.z;
  dVar5 = ON_Plane::UnsetPlane.xaxis.y;
  dVar4 = ON_Plane::UnsetPlane.xaxis.x;
  dVar3 = ON_Plane::UnsetPlane.origin.z;
  dVar2 = ON_Plane::UnsetPlane.origin.y;
  dVar1 = ON_Plane::UnsetPlane.origin.x;
  (this->m_object_frame).yaxis.x = ON_Plane::UnsetPlane.yaxis.x;
  (this->m_object_frame).yaxis.y = dVar7;
  (this->m_object_frame).xaxis.y = dVar5;
  (this->m_object_frame).xaxis.z = dVar6;
  (this->m_object_frame).origin.z = dVar3;
  (this->m_object_frame).xaxis.x = dVar4;
  (this->m_object_frame).origin.x = dVar1;
  (this->m_object_frame).origin.y = dVar2;
  ON_SimpleArray<int>::ON_SimpleArray(&this->m_group);
  this->m_private = (ON_3dmObjectAttributesPrivate *)0x0;
  ON_SimpleArray<ON_DisplayMaterialRef>::ON_SimpleArray(&this->m_dmref);
  CopyHelper(this,src);
  return;
}

Assistant:

ON_3dmObjectAttributes::ON_3dmObjectAttributes(const ON_3dmObjectAttributes& src) 
  : ON_Object(src)
  , m_color(0, 0, 0)
  , m_plot_color(0, 0, 0)
{
  CopyHelper(src);
}